

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libretro_main.c
# Opt level: O0

void retro_run(void)

{
  _Bool _Var1;
  int16_t iVar2;
  int local_1c;
  int iStack_18;
  char gb_color;
  int x;
  int y;
  int joypad_state;
  _Bool var_updated;
  gbstatus_e status;
  
  joypad_state = 0;
  y._3_1_ = 0;
  _Var1 = (*env_cb)(0x11,(void *)((long)&y + 3));
  if ((_Var1) && ((y._3_1_ & 1) != 0)) {
    check_variables();
  }
  x = 0;
  iVar2 = (*input_state_cb)(0,1,0,8);
  if (iVar2 != 0) {
    x = 0x10;
  }
  iVar2 = (*input_state_cb)(0,1,0,0);
  if (iVar2 != 0) {
    x = x | 0x20;
  }
  iVar2 = (*input_state_cb)(0,1,0,2);
  if (iVar2 != 0) {
    x = x | 0x40;
  }
  iVar2 = (*input_state_cb)(0,1,0,3);
  if (iVar2 != 0) {
    x = x | 0x80;
  }
  iVar2 = (*input_state_cb)(0,1,0,4);
  if (iVar2 != 0) {
    x = x | 4;
  }
  iVar2 = (*input_state_cb)(0,1,0,5);
  if (iVar2 != 0) {
    x = x | 8;
  }
  iVar2 = (*input_state_cb)(0,1,0,6);
  if (iVar2 != 0) {
    x = x | 2;
  }
  iVar2 = (*input_state_cb)(0,1,0,7);
  if (iVar2 != 0) {
    x = x | 1;
  }
  gb_emu_update_input(&gb_emu,x);
  while( true ) {
    if (((*gb_frame_ready_ptr ^ 0xffU) & 1) == 0) {
      gb_emu_grab_frame(&gb_emu);
      for (iStack_18 = 0; iStack_18 < 0x90; iStack_18 = iStack_18 + 1) {
        for (local_1c = 0; local_1c < 0xa0; local_1c = local_1c + 1) {
          *(fb_color_t *)(out_framebuffer + (iStack_18 * 0xa0 + local_1c) * 4) =
               curr_color_scheme[gb_framebuffer[iStack_18 * 0xa0 + local_1c]];
        }
      }
      (*video_cb)(out_framebuffer,0xa0,0x90,0x280);
      (*audio_cb)(0,0);
      return;
    }
    joypad_state = gb_emu_step(&gb_emu);
    if (joypad_state != GBSTATUS_OK) break;
    joypad_state = 0;
  }
  osd_msg("%s ([%s] %s)\n","Emulation error!",gbstatus_str_repr[(uint)joypad_state],gbstatus_str);
  return;
}

Assistant:

void retro_run()
{
   gbstatus_e status = GBSTATUS_OK;

   bool var_updated = false;
   if (env_cb(RETRO_ENVIRONMENT_GET_VARIABLE_UPDATE, &var_updated) && var_updated)
      check_variables();

   int joypad_state = 0;

   if (input_state_cb(0, RETRO_DEVICE_JOYPAD, 0, RETRO_DEVICE_ID_JOYPAD_A))
      joypad_state |= BUTTON_A;

   if (input_state_cb(0, RETRO_DEVICE_JOYPAD, 0, RETRO_DEVICE_ID_JOYPAD_B))
      joypad_state |= BUTTON_B;

   if (input_state_cb(0, RETRO_DEVICE_JOYPAD, 0, RETRO_DEVICE_ID_JOYPAD_SELECT))
      joypad_state |= BUTTON_SELECT;

   if (input_state_cb(0, RETRO_DEVICE_JOYPAD, 0, RETRO_DEVICE_ID_JOYPAD_START))
      joypad_state |= BUTTON_START;

   if (input_state_cb(0, RETRO_DEVICE_JOYPAD, 0, RETRO_DEVICE_ID_JOYPAD_UP))
      joypad_state |= BUTTON_UP;

   if (input_state_cb(0, RETRO_DEVICE_JOYPAD, 0, RETRO_DEVICE_ID_JOYPAD_DOWN))
      joypad_state |= BUTTON_DOWN;

   if (input_state_cb(0, RETRO_DEVICE_JOYPAD, 0, RETRO_DEVICE_ID_JOYPAD_LEFT))
      joypad_state |= BUTTON_LEFT;

   if (input_state_cb(0, RETRO_DEVICE_JOYPAD, 0, RETRO_DEVICE_ID_JOYPAD_RIGHT))
      joypad_state |= BUTTON_RIGHT;

   gb_emu_update_input(&gb_emu, joypad_state);

   while (!(*gb_frame_ready_ptr))
   {
      status = gb_emu_step(&gb_emu);
      if (status != GBSTATUS_OK)
      {
         GBSTATUS_ERR_PRINT("Emulation error!");
         return;
      }
   }

   gb_emu_grab_frame(&gb_emu);

   for (int y = 0; y < GB_SCREEN_HEIGHT; y++)
   {
      for (int x = 0; x < GB_SCREEN_WIDTH; x++)
      {
         char gb_color = gb_framebuffer[y * GB_SCREEN_WIDTH + x];
         memcpy(out_framebuffer + (y * GB_SCREEN_WIDTH + x) * 4, &curr_color_scheme[gb_color], sizeof(fb_color_t));
      }
   }

   video_cb(out_framebuffer, GB_SCREEN_WIDTH, GB_SCREEN_HEIGHT, GB_SCREEN_WIDTH * 4);
   audio_cb(0, 0);
}